

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  int iVar2;
  float *pfVar3;
  long lVar4;
  int iVar5;
  float *pfVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  __m128 afVar16;
  binary_op_pow op;
  __m128 _b0;
  __m128 _p_2;
  __m256 _b0_avx;
  __m512 _b0_avx512;
  binary_op_pow local_1b1;
  undefined8 local_1b0;
  Mat *local_1a8;
  ulong local_1a0;
  Mat *local_198;
  Mat *local_190;
  ulong local_188;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float afStack_170 [2];
  float afStack_168 [6];
  float local_150 [2];
  float afStack_148 [2];
  __m512 local_140;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float afStack_e0 [2];
  float afStack_d8 [2];
  float afStack_d0 [2];
  float afStack_c8 [2];
  __m512 local_c0 [2];
  
  uVar1 = a->c;
  iVar5 = a->h * a->w * a->d * a->elempack;
  local_198 = a;
  local_190 = b;
  Mat::create_like(c,a,opt->blob_allocator);
  local_1b0 = 0xffffffffffffff9c;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    local_1b0 = 0;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    local_1a0 = (ulong)uVar1;
    local_1a8 = c;
    for (local_188 = 0; local_188 != local_1a0; local_188 = local_188 + 1) {
      pfVar6 = (float *)(local_198->cstep * local_188 * local_198->elemsize + (long)local_198->data)
      ;
      local_140 = (__m512)vbroadcastss_avx512f(ZEXT416(*local_190->data));
      pfVar3 = (float *)(local_1a8->cstep * local_188 * local_1a8->elemsize + (long)local_1a8->data)
      ;
      local_c0[0] = local_140;
      for (iVar2 = 0; iVar2 + 0xf < iVar5; iVar2 = iVar2 + 0x10) {
        uVar9 = *(undefined8 *)pfVar6;
        uVar8 = *(undefined8 *)(pfVar6 + 2);
        uVar10 = *(undefined8 *)(pfVar6 + 4);
        uVar11 = *(undefined8 *)(pfVar6 + 6);
        uVar12 = *(undefined8 *)(pfVar6 + 8);
        uVar13 = *(undefined8 *)(pfVar6 + 10);
        uVar14 = *(undefined8 *)(pfVar6 + 0xc);
        uVar15 = *(undefined8 *)(pfVar6 + 0xe);
        _local_100 = uVar9;
        _fStack_f8 = uVar8;
        _fStack_f0 = uVar10;
        _fStack_e8 = uVar11;
        afStack_e0 = (float  [2])uVar12;
        afStack_d8 = (float  [2])uVar13;
        afStack_d0 = (float  [2])uVar14;
        afStack_c8 = (float  [2])uVar15;
        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                  (&local_1b1,(__m512 *)&local_100,local_c0);
        *(undefined8 *)pfVar3 = uVar9;
        *(undefined8 *)(pfVar3 + 2) = uVar8;
        *(undefined8 *)(pfVar3 + 4) = uVar10;
        *(undefined8 *)(pfVar3 + 6) = uVar11;
        *(undefined8 *)(pfVar3 + 8) = uVar12;
        *(undefined8 *)(pfVar3 + 10) = uVar13;
        *(undefined8 *)(pfVar3 + 0xc) = uVar14;
        *(undefined8 *)(pfVar3 + 0xe) = uVar15;
        pfVar6 = pfVar6 + 0x10;
        pfVar3 = pfVar3 + 0x10;
      }
      fStack_fc = local_140[0];
      local_100 = local_140[0];
      fStack_f4 = local_140[0];
      fStack_f8 = local_140[0];
      fStack_ec = local_140[0];
      fStack_f0 = local_140[0];
      fStack_e4 = local_140[0];
      fStack_e8 = local_140[0];
      for (; iVar2 + 7 < iVar5; iVar2 = iVar2 + 8) {
        uVar9 = *(undefined8 *)pfVar6;
        uVar8 = *(undefined8 *)(pfVar6 + 2);
        uVar10 = *(undefined8 *)(pfVar6 + 4);
        uVar11 = *(undefined8 *)(pfVar6 + 6);
        _local_180 = uVar9;
        _fStack_178 = uVar8;
        afStack_170 = (float  [2])uVar10;
        afStack_168._0_8_ = uVar11;
        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                  (&local_1b1,(__m256 *)&local_180,(__m256 *)&local_100);
        *(undefined8 *)pfVar3 = uVar9;
        *(undefined8 *)(pfVar3 + 2) = uVar8;
        *(undefined8 *)(pfVar3 + 4) = uVar10;
        *(undefined8 *)(pfVar3 + 6) = uVar11;
        pfVar6 = pfVar6 + 8;
        pfVar3 = pfVar3 + 8;
      }
      fStack_17c = local_140[0];
      local_180 = local_140[0];
      fStack_174 = local_140[0];
      fStack_178 = local_140[0];
      for (; iVar2 + 3 < iVar5; iVar2 = iVar2 + 4) {
        local_150 = *(float (*) [2])pfVar6;
        uVar9 = *(undefined8 *)(pfVar6 + 2);
        afStack_148 = (float  [2])uVar9;
        afVar16 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                            (&local_1b1,(__m128 *)local_150,(__m128 *)&local_180);
        *(long *)pfVar3 = afVar16._0_8_;
        *(undefined8 *)(pfVar3 + 2) = uVar9;
        pfVar6 = pfVar6 + 4;
        pfVar3 = pfVar3 + 4;
      }
      lVar4 = 0;
      for (; iVar2 < iVar5; iVar2 = iVar2 + 1) {
        fVar7 = powf(*(float *)((long)pfVar6 + lVar4),local_140[0]);
        *(float *)((long)pfVar3 + lVar4) = fVar7;
        lVar4 = lVar4 + 4;
      }
    }
  }
  return (int)local_1b0;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}